

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O0

double __thiscall
VarianceSwapsHestonAnalyticalPricer::price
          (VarianceSwapsHestonAnalyticalPricer *this,VarianceSwap *varianceSwap)

{
  reference pvVar1;
  size_type sVar2;
  double dVar3;
  pointer pdVar4;
  ulong local_50;
  size_t i;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> dates;
  double price;
  VarianceSwap *varianceSwap_local;
  VarianceSwapsHestonAnalyticalPricer *this_local;
  
  dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  VarianceSwap::getDates((vector<double,_std::allocator<double>_> *)local_38,varianceSwap);
  pdVar4 = dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,0);
  dVar3 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,1);
  dVar3 = u1Term(this,dVar3,*pvVar1);
  dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((double)pdVar4 + dVar3);
  local_50 = 2;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_38);
    pdVar4 = dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (sVar2 <= local_50) break;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,local_50 - 1);
    dVar3 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,local_50);
    dVar3 = uiTerm(this,dVar3,*pvVar1);
    dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)((double)pdVar4 + dVar3);
    local_50 = local_50 + 1;
  }
  dVar3 = (double)dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage * 10000.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::back
                     ((vector<double,_std::allocator<double>_> *)local_38);
  pdVar4 = (pointer)(dVar3 / *pvVar1);
  dates.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pdVar4;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return (double)pdVar4;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::price(const VarianceSwap& varianceSwap) const{
    double price=0;
    std::vector<double> dates = varianceSwap.getDates();

    price = price + u1Term(dates[0],dates[1]);
    for (std::size_t i = 2; i < dates.size(); i++)
    {   
        // std::cout << uiTerm(dates[i-1],dates[i]) << std::endl;
        price = price + uiTerm(dates[i-1],dates[i]);
    }
    price = price * 10000. / dates.back();
    return price;
}